

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::blend_func_separate(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_ENUM is generated if srcRGB, dstRGB, srcAlpha, or dstAlpha is not an accepted value."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glBlendFuncSeparate(&local_10->super_CallLogWrapper,0xffffffff,1,0x300,0x301)
  ;
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glBlendFuncSeparate(&local_10->super_CallLogWrapper,0,0xffffffff,0x300,0x301)
  ;
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glBlendFuncSeparate(&local_10->super_CallLogWrapper,0,1,0xffffffff,0x301);
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glBlendFuncSeparate(&local_10->super_CallLogWrapper,0,1,0x300,0xffffffff);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void blend_func_separate (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if srcRGB, dstRGB, srcAlpha, or dstAlpha is not an accepted value.");
	ctx.glBlendFuncSeparate(-1, GL_ONE, GL_SRC_COLOR, GL_ONE_MINUS_SRC_COLOR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBlendFuncSeparate(GL_ZERO, -1, GL_SRC_COLOR, GL_ONE_MINUS_SRC_COLOR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBlendFuncSeparate(GL_ZERO, GL_ONE, -1, GL_ONE_MINUS_SRC_COLOR);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBlendFuncSeparate(GL_ZERO, GL_ONE, GL_SRC_COLOR, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}